

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeMemGetAllocProperties
          (ze_context_handle_t hContext,void *ptr,
          ze_memory_allocation_properties_t *pMemAllocProperties,ze_device_handle_t *phDevice)

{
  ze_result_t zVar1;
  
  if (DAT_0010d4d0 != (code *)0x0) {
    zVar1 = (*DAT_0010d4d0)();
    return zVar1;
  }
  if (phDevice != (ze_device_handle_t *)0x0) {
    context_t::get()::count = context_t::get()::count + 1;
    *phDevice = context_t::get()::count;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetAllocProperties(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] memory pointer to query
        ze_memory_allocation_properties_t* pMemAllocProperties, ///< [in,out] query result for memory allocation properties
        ze_device_handle_t* phDevice                    ///< [out][optional] device associated with this allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetAllocProperties = context.zeDdiTable.Mem.pfnGetAllocProperties;
        if( nullptr != pfnGetAllocProperties )
        {
            result = pfnGetAllocProperties( hContext, ptr, pMemAllocProperties, phDevice );
        }
        else
        {
            // generic implementation
            if( nullptr != phDevice ) *phDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }